

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ref_ptr.h
# Opt level: O0

scoped_refptr<webrtc::LockedIsacBandwidthInfo> * __thiscall
rtc::scoped_refptr<webrtc::LockedIsacBandwidthInfo>::operator=
          (scoped_refptr<webrtc::LockedIsacBandwidthInfo> *this,LockedIsacBandwidthInfo *p)

{
  LockedIsacBandwidthInfo *p_local;
  scoped_refptr<webrtc::LockedIsacBandwidthInfo> *this_local;
  
  if (p != (LockedIsacBandwidthInfo *)0x0) {
    webrtc::LockedIsacBandwidthInfo::AddRef(p);
  }
  if (this->ptr_ != (LockedIsacBandwidthInfo *)0x0) {
    webrtc::LockedIsacBandwidthInfo::Release(this->ptr_);
  }
  this->ptr_ = p;
  return this;
}

Assistant:

scoped_refptr<T>& operator=(T* p) {
    // AddRef first so that self assignment should work
    if (p)
      p->AddRef();
    if (ptr_ )
      ptr_ ->Release();
    ptr_ = p;
    return *this;
  }